

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnMemoryCopyExpr
          (BinaryReaderInterp *this,Index destmemidx,Index srcmemidx)

{
  Result RVar1;
  Location loc_2;
  Location loc_1;
  Location loc;
  Location local_128;
  Location local_108;
  Location local_e8;
  Var local_c0;
  Var local_78;
  
  local_e8.field_1.field_0.last_column = 0;
  local_e8.filename._M_len = (this->filename_)._M_len;
  local_e8.filename._M_str = (this->filename_)._M_str;
  local_108.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_108.field_1.field_0.last_column = 0;
  local_108.filename._M_len = (this->filename_)._M_len;
  local_108.filename._M_str = (this->filename_)._M_str;
  local_e8.field_1.field_1.offset = local_108.field_1.field_1.offset;
  Var::Var(&local_78,destmemidx,&local_108);
  local_128.field_1.field_0.last_column = 0;
  local_128.filename._M_len = (this->filename_)._M_len;
  local_128.filename._M_str = (this->filename_)._M_str;
  local_128.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  Var::Var(&local_c0,srcmemidx,&local_128);
  RVar1 = SharedValidator::OnMemoryCopy(&this->validator_,&local_e8,&local_78,&local_c0);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,MemoryCopy,destmemidx,srcmemidx);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnMemoryCopyExpr(Index destmemidx, Index srcmemidx) {
  CHECK_RESULT(validator_.OnMemoryCopy(GetLocation(),
                                       Var(destmemidx, GetLocation()),
                                       Var(srcmemidx, GetLocation())));
  istream_.Emit(Opcode::MemoryCopy, destmemidx, srcmemidx);
  return Result::Ok;
}